

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

void VP8LBitReaderSetBuffer(VP8LBitReader *br,uint8_t *buf,size_t len)

{
  uint uVar1;
  
  br->buf_ = buf;
  br->len_ = len;
  uVar1 = 1;
  if (((br->pos_ <= len) && (br->eos_ == 0)) && (uVar1 = 0, br->pos_ == len)) {
    uVar1 = (uint)(0x40 < br->bit_pos_);
  }
  br->eos_ = uVar1;
  return;
}

Assistant:

void VP8LBitReaderSetBuffer(VP8LBitReader* const br,
                            const uint8_t* const buf, size_t len) {
  assert(br != NULL);
  assert(buf != NULL);
  assert(len < 0xfffffff8u);   // can't happen with a RIFF chunk.
  br->buf_ = buf;
  br->len_ = len;
  // pos_ > len_ should be considered a param error.
  br->eos_ = (br->pos_ > br->len_) || VP8LIsEndOfStream(br);
}